

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O2

void __thiscall test::test_generate_and_sign::test_method(test_generate_and_sign *this)

{
  bool bVar1;
  long *local_108;
  undefined **local_100;
  ulong local_f8;
  shared_count sStack_f0;
  char *local_e8;
  allocator local_e0 [8];
  undefined8 local_d8;
  shared_count sStack_d0;
  string signature;
  string privateK;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  char *local_38;
  char *local_30;
  
  license::CryptoHelper::getInstance();
  (**(code **)*local_108)();
  (**(code **)(*local_108 + 8))(&privateK);
  local_38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
  ;
  local_30 = "";
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_38,0x31);
  bVar1 = boost::algorithm::starts_with<std::__cxx11::string,char[32],boost::algorithm::is_equal>
                    (&privateK,"-----BEGIN RSA PRIVATE KEY-----");
  local_100 = (undefined **)CONCAT71(local_100._1_7_,bVar1);
  local_f8 = 0;
  sStack_f0.pi_ = (sp_counted_base *)0x0;
  signature._M_string_length._0_1_ = 0;
  signature._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00541d70;
  signature.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  signature.field_2._8_8_ = anon_var_dwarf_bbcb;
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
  ;
  local_50 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_f0);
  std::__cxx11::string::string((string *)&local_100,"testString",local_e0);
  (**(code **)(*local_108 + 0x28))(&signature,local_108,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
  ;
  local_60 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x33);
  local_e0[0] = (allocator)
                (CONCAT71(signature._M_string_length._1_7_,(undefined1)signature._M_string_length)
                == 0xac);
  local_d8 = 0;
  sStack_d0.pi_ = (sp_counted_base *)0x0;
  local_f8 = local_f8 & 0xffffffffffffff00;
  local_100 = &PTR__lazy_ostream_00541db0;
  sStack_f0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e8 = "signature is the right size";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d0);
  std::__cxx11::string::~string((string *)&signature);
  std::__cxx11::string::~string((string *)&privateK);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_generate_and_sign) {
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	crypto->generateKeyPair();
	const string privateK = crypto->exportPrivateKey();
	BOOST_CHECK_MESSAGE(boost::starts_with(privateK, "-----BEGIN RSA PRIVATE KEY-----"),
						"Private key is in openssl pkcs#1 format");
	const std::string signature = crypto->signString("testString");
	BOOST_CHECK_MESSAGE(signature.size() == 172, "signature is the right size");
	crypto.release();
	/*
	 ofstream myfile("private_key-linux.rsa");
	 myfile << privateK;
	 myfile.close();*/
}